

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O3

StringU16 * Jinx::Impl::ConvertUtf8ToUtf16(StringU16 *__return_storage_ptr__,String *utf8Str)

{
  size_type __res;
  int iVar1;
  size_t sVar2;
  char32_t cVar3;
  ushort *puVar4;
  pointer utf8In;
  char32_t utf32CodePoint;
  char16_t local_4a;
  ushort local_48;
  ushort local_46;
  char32_t local_44;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>_11
  *local_38;
  
  utf8In = (utf8Str->_M_dataplus)._M_p;
  __res = utf8Str->_M_string_length;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::
  reserve(__return_storage_ptr__,__res);
  iVar1 = (int)utf8In;
  while (*utf8In != '\0') {
    ConvertUtf8ToUtf32(utf8In,(ulong)(uint)(((int)__res + iVar1) - (int)utf8In),&local_44,&local_40)
    ;
    if ((uint)local_44 < 0x10000) {
      sVar2 = 1;
      puVar4 = &local_48;
      cVar3 = local_44;
    }
    else {
      cVar3 = (uint)(local_44 + L'\x000f0000') >> 10 & 0x3ff | 0xd800;
      local_48 = (ushort)local_44 & 0x3ff | 0xdc00;
      sVar2 = 2;
      puVar4 = &local_46;
    }
    local_4a = (char16_t)cVar3;
    utf8In = utf8In + local_40;
    *puVar4 = 0;
    local_40 = sVar2;
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::
    append(__return_storage_ptr__,&local_4a);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t StringU16 ConvertUtf8ToUtf16(const String & utf8Str)
	{
		const char * cInStr = utf8Str.c_str();
		const char * cInStrEnd = cInStr + utf8Str.size();
		StringU16 outString;
		outString.reserve(utf8Str.size());
		char16_t outBuffer[3];
		char32_t utf32CodePoint;
		size_t numOut;
		while (*cInStr != 0)
		{
			Impl::ConvertUtf8ToUtf32(cInStr, (uint32_t)(cInStrEnd - cInStr), &utf32CodePoint, &numOut);
			cInStr += numOut;
			Impl::ConvertUtf32ToUtf16(utf32CodePoint, outBuffer, std::size(outBuffer), &numOut);
			outBuffer[numOut] = 0;
			outString += outBuffer;
		}
		return outString;
	}